

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

int stbi__process_frame_header(stbi__jpeg *z,int scan)

{
  int a;
  int b;
  undefined8 *puVar1;
  stbi__uint32 b_00;
  stbi__context *s;
  byte bVar2;
  uint uVar3;
  stbi__uint32 sVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  char *pcVar9;
  stbi_uc *psVar10;
  byte *pbVar11;
  void *pvVar12;
  int extraout_EDX;
  int extraout_EDX_00;
  int why;
  int iVar13;
  long lVar14;
  ulong uVar15;
  int iVar16;
  int *piVar17;
  ulong uVar18;
  long in_FS_OFFSET;
  
  s = z->s;
  uVar3 = stbi__get16be(s);
  if (uVar3 < 0xb) {
LAB_00161d94:
    pcVar9 = "Corrupt JPEG";
  }
  else {
    psVar10 = s->img_buffer;
    if (psVar10 < s->img_buffer_end) {
LAB_00161dc6:
      s->img_buffer = psVar10 + 1;
      if (*psVar10 == '\b') {
        sVar4 = stbi__get16be(s);
        s->img_y = sVar4;
        if (sVar4 == 0) {
          pcVar9 = "JPEG format not supported: delayed height";
          goto LAB_00161e18;
        }
        sVar4 = stbi__get16be(s);
        s->img_x = sVar4;
        if (sVar4 == 0) goto LAB_00161d94;
        if (0x1000000 < s->img_y) {
          pcVar9 = "Very large image (corrupt?)";
          goto LAB_00161e18;
        }
        pbVar11 = s->img_buffer;
        if (pbVar11 < s->img_buffer_end) {
LAB_00161e60:
          s->img_buffer = pbVar11 + 1;
          bVar2 = *pbVar11;
        }
        else {
          if (s->read_from_callbacks != 0) {
            stbi__refill_buffer(s);
            pbVar11 = s->img_buffer;
            goto LAB_00161e60;
          }
          bVar2 = 0;
        }
        if ((bVar2 < 5) && ((0x1aU >> (bVar2 & 0x1f) & 1) != 0)) {
          s->img_n = (uint)bVar2;
          if (bVar2 != 0) {
            lVar14 = 0;
            do {
              *(undefined8 *)((long)&z->img_comp[0].data + lVar14) = 0;
              *(undefined8 *)((long)&z->img_comp[0].linebuf + lVar14) = 0;
              lVar14 = lVar14 + 0x60;
            } while ((ulong)bVar2 * 0x60 != lVar14);
          }
          if (uVar3 == (uint)bVar2 + (uint)bVar2 * 2 + 8) {
            z->rgb = 0;
            uVar18 = (ulong)(uint)s->img_n;
            if (0 < s->img_n) {
              piVar17 = &z->img_comp[0].tq;
              lVar14 = 0;
              do {
                pbVar11 = s->img_buffer;
                if (pbVar11 < s->img_buffer_end) {
LAB_00161f0e:
                  s->img_buffer = pbVar11 + 1;
                  bVar2 = *pbVar11;
                }
                else {
                  if (s->read_from_callbacks != 0) {
                    stbi__refill_buffer(s);
                    pbVar11 = s->img_buffer;
                    goto LAB_00161f0e;
                  }
                  bVar2 = 0;
                }
                ((anon_struct_96_18_0d0905d3 *)(piVar17 + -3))->id = (uint)bVar2;
                if ((s->img_n == 3) && (bVar2 == "RGB"[lVar14])) {
                  z->rgb = z->rgb + 1;
                }
                pbVar11 = s->img_buffer;
                if (pbVar11 < s->img_buffer_end) {
LAB_00161f68:
                  s->img_buffer = pbVar11 + 1;
                  bVar2 = *pbVar11;
                }
                else {
                  if (s->read_from_callbacks != 0) {
                    stbi__refill_buffer(s);
                    pbVar11 = s->img_buffer;
                    goto LAB_00161f68;
                  }
                  bVar2 = 0;
                }
                piVar17[-2] = (uint)(bVar2 >> 4);
                if (((byte)(bVar2 + 0xb0) < 0xc0) ||
                   (piVar17[-1] = bVar2 & 0xf, (bVar2 & 0xf) - 5 < 0xfffffffc)) goto LAB_00161d94;
                pbVar11 = s->img_buffer;
                if (pbVar11 < s->img_buffer_end) {
LAB_00161fc8:
                  s->img_buffer = pbVar11 + 1;
                  bVar2 = *pbVar11;
                }
                else {
                  if (s->read_from_callbacks != 0) {
                    stbi__refill_buffer(s);
                    pbVar11 = s->img_buffer;
                    goto LAB_00161fc8;
                  }
                  bVar2 = 0;
                }
                *piVar17 = (uint)bVar2;
                if (3 < bVar2) goto LAB_00161d94;
                lVar14 = lVar14 + 1;
                uVar18 = (ulong)s->img_n;
                piVar17 = piVar17 + 0x18;
              } while (lVar14 < (long)uVar18);
            }
            if (scan != 0) {
              return 1;
            }
            sVar4 = s->img_x;
            b_00 = s->img_y;
            iVar8 = (int)uVar18;
            iVar5 = stbi__mad3sizes_valid(sVar4,b_00,iVar8,0);
            if (iVar5 == 0) {
              *(char **)(in_FS_OFFSET + -0x10) = "Image too large to decode";
              return 0;
            }
            uVar3 = 1;
            uVar15 = 1;
            if (0 < iVar8) {
              uVar15 = 1;
              lVar14 = 0;
              uVar3 = 1;
              do {
                uVar6 = *(uint *)((long)&z->img_comp[0].h + lVar14);
                uVar7 = *(uint *)((long)&z->img_comp[0].v + lVar14);
                if ((int)uVar3 < (int)uVar6) {
                  uVar3 = uVar6;
                }
                if ((int)uVar15 < (int)uVar7) {
                  uVar15 = (ulong)uVar7;
                }
                lVar14 = lVar14 + 0x60;
              } while ((uVar18 & 0xffffffff) * 0x60 != lVar14);
            }
            z->img_h_max = uVar3;
            iVar5 = (int)uVar15;
            z->img_v_max = iVar5;
            z->img_mcu_w = uVar3 * 8;
            z->img_mcu_h = iVar5 * 8;
            uVar6 = ((sVar4 + uVar3 * 8) - 1) / (uVar3 * 8);
            z->img_mcu_x = uVar6;
            uVar7 = ((b_00 + iVar5 * 8) - 1) / (uint)(iVar5 * 8);
            z->img_mcu_y = uVar7;
            if (iVar8 < 1) {
              return 1;
            }
            iVar8 = 1;
            lVar14 = 0;
            while( true ) {
              iVar16 = *(int *)((long)&z->img_comp[0].h + lVar14);
              iVar13 = *(int *)((long)&z->img_comp[0].v + lVar14);
              *(uint *)((long)&z->img_comp[0].x + lVar14) = (iVar16 * sVar4 + (uVar3 - 1)) / uVar3;
              *(int *)((long)&z->img_comp[0].y + lVar14) =
                   (int)((iVar13 * b_00 + iVar5 + -1) / uVar15);
              iVar16 = iVar16 * uVar6;
              a = iVar16 * 8;
              *(int *)((long)&z->img_comp[0].w2 + lVar14) = a;
              iVar13 = iVar13 * uVar7;
              b = iVar13 * 8;
              *(int *)((long)&z->img_comp[0].h2 + lVar14) = b;
              pvVar12 = stbi__malloc_mad2(a,b,0xf);
              puVar1 = (undefined8 *)((long)&z->img_comp[0].raw_coeff + lVar14);
              *puVar1 = 0;
              puVar1[1] = 0;
              *(undefined8 *)((long)&z->img_comp[0].coeff + lVar14) = 0;
              *(void **)((long)&z->img_comp[0].raw_data + lVar14) = pvVar12;
              why = extraout_EDX;
              if (pvVar12 == (void *)0x0) break;
              *(ulong *)((long)&z->img_comp[0].data + lVar14) =
                   (long)pvVar12 + 0xfU & 0xfffffffffffffff0;
              if (z->progressive != 0) {
                *(int *)((long)&z->img_comp[0].coeff_w + lVar14) = iVar16;
                *(int *)((long)&z->img_comp[0].coeff_h + lVar14) = iVar13;
                pvVar12 = stbi__malloc_mad3(a,b,2,0xf);
                *(void **)((long)&z->img_comp[0].raw_coeff + lVar14) = pvVar12;
                why = extraout_EDX_00;
                if (pvVar12 == (void *)0x0) break;
                *(ulong *)((long)&z->img_comp[0].coeff + lVar14) =
                     (long)pvVar12 + 0xfU & 0xfffffffffffffff0;
              }
              iVar8 = iVar8 + 1;
              lVar14 = lVar14 + 0x60;
              if ((uVar18 & 0xffffffff) * 0x60 == lVar14) {
                return 1;
              }
            }
            *(char **)(in_FS_OFFSET + -0x10) = "Out of memory";
            stbi__free_jpeg_components(z,iVar8,why);
            return 0;
          }
        }
        goto LAB_00161d94;
      }
    }
    else if (s->read_from_callbacks != 0) {
      stbi__refill_buffer(s);
      psVar10 = s->img_buffer;
      goto LAB_00161dc6;
    }
    pcVar9 = "JPEG format not supported: 8-bit only";
  }
LAB_00161e18:
  *(char **)(in_FS_OFFSET + -0x10) = pcVar9;
  return 0;
}

Assistant:

static int stbi__process_frame_header(stbi__jpeg *z, int scan)
{
   stbi__context *s = z->s;
   int Lf,p,i,q, h_max=1,v_max=1,c;
   Lf = stbi__get16be(s);         if (Lf < 11) return stbi__err("bad SOF len","Corrupt JPEG"); // JPEG
   p  = stbi__get8(s);            if (p != 8) return stbi__err("only 8-bit","JPEG format not supported: 8-bit only"); // JPEG baseline
   s->img_y = stbi__get16be(s);   if (s->img_y == 0) return stbi__err("no header height", "JPEG format not supported: delayed height"); // Legal, but we don't handle it--but neither does IJG
   s->img_x = stbi__get16be(s);   if (s->img_x == 0) return stbi__err("0 width","Corrupt JPEG"); // JPEG requires
   if (s->img_y > STBI_MAX_DIMENSIONS) return stbi__err("too large","Very large image (corrupt?)");
   if (s->img_x > STBI_MAX_DIMENSIONS) return stbi__err("too large","Very large image (corrupt?)");
   c = stbi__get8(s);
   if (c != 3 && c != 1 && c != 4) return stbi__err("bad component count","Corrupt JPEG");
   s->img_n = c;
   for (i=0; i < c; ++i) {
      z->img_comp[i].data = NULL;
      z->img_comp[i].linebuf = NULL;
   }

   if (Lf != 8+3*s->img_n) return stbi__err("bad SOF len","Corrupt JPEG");

   z->rgb = 0;
   for (i=0; i < s->img_n; ++i) {
      static const unsigned char rgb[3] = { 'R', 'G', 'B' };
      z->img_comp[i].id = stbi__get8(s);
      if (s->img_n == 3 && z->img_comp[i].id == rgb[i])
         ++z->rgb;
      q = stbi__get8(s);
      z->img_comp[i].h = (q >> 4);  if (!z->img_comp[i].h || z->img_comp[i].h > 4) return stbi__err("bad H","Corrupt JPEG");
      z->img_comp[i].v = q & 15;    if (!z->img_comp[i].v || z->img_comp[i].v > 4) return stbi__err("bad V","Corrupt JPEG");
      z->img_comp[i].tq = stbi__get8(s);  if (z->img_comp[i].tq > 3) return stbi__err("bad TQ","Corrupt JPEG");
   }

   if (scan != STBI__SCAN_load) return 1;

   if (!stbi__mad3sizes_valid(s->img_x, s->img_y, s->img_n, 0)) return stbi__err("too large", "Image too large to decode");

   for (i=0; i < s->img_n; ++i) {
      if (z->img_comp[i].h > h_max) h_max = z->img_comp[i].h;
      if (z->img_comp[i].v > v_max) v_max = z->img_comp[i].v;
   }

   // compute interleaved mcu info
   z->img_h_max = h_max;
   z->img_v_max = v_max;
   z->img_mcu_w = h_max * 8;
   z->img_mcu_h = v_max * 8;
   // these sizes can't be more than 17 bits
   z->img_mcu_x = (s->img_x + z->img_mcu_w-1) / z->img_mcu_w;
   z->img_mcu_y = (s->img_y + z->img_mcu_h-1) / z->img_mcu_h;

   for (i=0; i < s->img_n; ++i) {
      // number of effective pixels (e.g. for non-interleaved MCU)
      z->img_comp[i].x = (s->img_x * z->img_comp[i].h + h_max-1) / h_max;
      z->img_comp[i].y = (s->img_y * z->img_comp[i].v + v_max-1) / v_max;
      // to simplify generation, we'll allocate enough memory to decode
      // the bogus oversized data from using interleaved MCUs and their
      // big blocks (e.g. a 16x16 iMCU on an image of width 33); we won't
      // discard the extra data until colorspace conversion
      //
      // img_mcu_x, img_mcu_y: <=17 bits; comp[i].h and .v are <=4 (checked earlier)
      // so these muls can't overflow with 32-bit ints (which we require)
      z->img_comp[i].w2 = z->img_mcu_x * z->img_comp[i].h * 8;
      z->img_comp[i].h2 = z->img_mcu_y * z->img_comp[i].v * 8;
      z->img_comp[i].coeff = 0;
      z->img_comp[i].raw_coeff = 0;
      z->img_comp[i].linebuf = NULL;
      z->img_comp[i].raw_data = stbi__malloc_mad2(z->img_comp[i].w2, z->img_comp[i].h2, 15);
      if (z->img_comp[i].raw_data == NULL)
         return stbi__free_jpeg_components(z, i+1, stbi__err("outofmem", "Out of memory"));
      // align blocks for idct using mmx/sse
      z->img_comp[i].data = (stbi_uc*) (((size_t) z->img_comp[i].raw_data + 15) & ~15);
      if (z->progressive) {
         // w2, h2 are multiples of 8 (see above)
         z->img_comp[i].coeff_w = z->img_comp[i].w2 / 8;
         z->img_comp[i].coeff_h = z->img_comp[i].h2 / 8;
         z->img_comp[i].raw_coeff = stbi__malloc_mad3(z->img_comp[i].w2, z->img_comp[i].h2, sizeof(short), 15);
         if (z->img_comp[i].raw_coeff == NULL)
            return stbi__free_jpeg_components(z, i+1, stbi__err("outofmem", "Out of memory"));
         z->img_comp[i].coeff = (short*) (((size_t) z->img_comp[i].raw_coeff + 15) & ~15);
      }
   }

   return 1;
}